

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_unittest.pb.cc
# Opt level: O2

void proto2_unittest::TestRequiredMessageMap::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  TestRequiredMessageMap *_this;
  TestRequiredMessageMap *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestRequiredMessageMap *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestRequiredMessageMap_const*,proto2_unittest::TestRequiredMessageMap*>
                          ((TestRequiredMessageMap **)local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::internal::TypeDefinedMapFieldBase<int,_proto2_unittest::TestRequired>::
    MergeFrom((TypeDefinedMapFieldBase<int,_proto2_unittest::TestRequired> *)
              &(local_20->field_0)._impl_,
              (TypeDefinedMapFieldBase<int,_proto2_unittest::TestRequired> *)(from_msg + 1));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/map_unittest.pb.cc"
             ,0x222c,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void TestRequiredMessageMap::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestRequiredMessageMap*>(&to_msg);
  auto& from = static_cast<const TestRequiredMessageMap&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestRequiredMessageMap)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_.map_field_.MergeFrom(from._impl_.map_field_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}